

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vpath.cpp
# Opt level: O3

float tForArcAngle(float angle)

{
  float fVar1;
  float fVar2;
  float fVar3;
  
  fVar2 = 0.0;
  if (1e-06 <= ABS(angle)) {
    if (1e-06 <= ABS(angle + -90.0)) {
      fVar2 = (angle / 180.0) * 3.141592;
      fVar1 = cosf(fVar2);
      fVar2 = sinf(fVar2);
      fVar3 = angle / 90.0;
      fVar3 = fVar3 - (((fVar3 * 0.3431456 + -1.3431456) * fVar3 * fVar3 + 1.0) - fVar1) /
                      ((fVar3 * 1.0294371 + -2.6862912) * fVar3);
      fVar3 = fVar3 - (((fVar3 * 0.3431456 + -1.3431456) * fVar3 * fVar3 + 1.0) - fVar1) /
                      ((fVar3 * 1.0294371 + -2.6862912) * fVar3);
      fVar1 = fVar3 - (((fVar3 * -0.3431456 + -3.3137088 + 3.0) * fVar3 + 1.6568544) * fVar3 - fVar2
                      ) / ((fVar3 * -1.0294371 + 6.6274176 + -6.0) * fVar3 + 1.6568544);
      fVar2 = ((fVar1 - (((fVar1 * -0.3431456 + -3.3137088 + 3.0) * fVar1 + 1.6568544) * fVar1 -
                        fVar2) / ((fVar1 * -1.0294371 + 6.6274176 + -6.0) * fVar1 + 1.6568544)) +
              fVar3) * 0.5;
    }
    else {
      fVar2 = 1.0;
    }
  }
  return fVar2;
}

Assistant:

static float tForArcAngle(float angle)
{
    float radians, cos_angle, sin_angle, tc, ts, t;

    if (vCompare(angle, 0.f)) return 0;
    if (vCompare(angle, 90.0f)) return 1;

    radians = (angle / 180) * K_PI;

    cos_angle = cosf(radians);
    sin_angle = sinf(radians);

    // initial guess
    tc = angle / 90;

    // do some iterations of newton's method to approximate cos_angle
    // finds the zero of the function b.pointAt(tc).x() - cos_angle
    tc -= ((((2 - 3 * PATH_KAPPA) * tc + 3 * (PATH_KAPPA - 1)) * tc) * tc + 1 -
           cos_angle)  // value
          / (((6 - 9 * PATH_KAPPA) * tc + 6 * (PATH_KAPPA - 1)) *
             tc);  // derivative
    tc -= ((((2 - 3 * PATH_KAPPA) * tc + 3 * (PATH_KAPPA - 1)) * tc) * tc + 1 -
           cos_angle)  // value
          / (((6 - 9 * PATH_KAPPA) * tc + 6 * (PATH_KAPPA - 1)) *
             tc);  // derivative

    // initial guess
    ts = tc;
    // do some iterations of newton's method to approximate sin_angle
    // finds the zero of the function b.pointAt(tc).y() - sin_angle
    ts -= ((((3 * PATH_KAPPA - 2) * ts - 6 * PATH_KAPPA + 3) * ts +
            3 * PATH_KAPPA) *
               ts -
           sin_angle) /
          (((9 * PATH_KAPPA - 6) * ts + 12 * PATH_KAPPA - 6) * ts +
           3 * PATH_KAPPA);
    ts -= ((((3 * PATH_KAPPA - 2) * ts - 6 * PATH_KAPPA + 3) * ts +
            3 * PATH_KAPPA) *
               ts -
           sin_angle) /
          (((9 * PATH_KAPPA - 6) * ts + 12 * PATH_KAPPA - 6) * ts +
           3 * PATH_KAPPA);

    // use the average of the t that best approximates cos_angle
    // and the t that best approximates sin_angle
    t = 0.5f * (tc + ts);
    return t;
}